

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

BlendEq deqp::gles31::Functional::anon_unknown_0::getRandomBlendEq(Random *rng)

{
  deUint32 dVar1;
  uint *puVar2;
  uint local_28 [2];
  BlendEq eqs [5];
  Random *rng_local;
  
  local_28[0] = 0x8006;
  local_28[1] = 0x800a;
  eqs[0] = 0x800b;
  eqs[1] = 0x8007;
  eqs[2] = 0x8008;
  unique0x1000004a = rng;
  dVar1 = de::Random::getUint32(rng);
  puVar2 = de::getSizedArrayElement<5,5,unsigned_int>((uint (*) [5])local_28,dVar1 % 5);
  return *puVar2;
}

Assistant:

BlendEq getRandomBlendEq (de::Random& rng)
{
	const BlendEq eqs[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	return de::getSizedArrayElement<DE_LENGTH_OF_ARRAY(eqs)>(eqs, rng.getUint32() % DE_LENGTH_OF_ARRAY(eqs));
}